

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O1

shared_ptr<Form> __thiscall
LinkedObjectFile::to_form_script
          (LinkedObjectFile *this,int seg,int word_idx,vector<bool,_std::allocator<bool>_> *seen)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pvVar3;
  long lVar4;
  pointer pLVar5;
  bool bVar6;
  element_type *peVar7;
  _func_int **pp_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  bool bVar10;
  uint uVar11;
  undefined8 *puVar12;
  ulong uVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  undefined4 in_register_00000034;
  LinkedObjectFile *this_00;
  ulong uVar15;
  vector<bool,_std::allocator<bool>_> *in_R8;
  uint uVar16;
  reference rVar17;
  shared_ptr<Form> sVar18;
  shared_ptr<Form> fill;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  ulong local_50;
  _func_int **local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  long local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  
  this_00 = (LinkedObjectFile *)CONCAT44(in_register_00000034,seg);
  (this->stats).total_code_bytes = 0;
  (this->stats).total_v2_code_bytes = 0;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  (local_58._M_pi)->_M_use_count = 1;
  (local_58._M_pi)->_M_weak_count = 1;
  (local_58._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0015b690;
  local_60 = local_58._M_pi + 1;
  local_58._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_58._M_pi[1]._M_use_count = 0;
  local_58._M_pi[1]._M_weak_count = 0;
  local_58._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_58._M_pi[2]._M_use_count = 0;
  local_58._M_pi[2]._M_weak_count = 0;
  local_58._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_58._M_pi[3]._M_use_count = 0;
  local_58._M_pi[3]._M_weak_count = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->stats).total_v2_pointers =
       local_58._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->stats = local_60;
  *(undefined4 *)&local_58._M_pi[1]._vptr__Sp_counted_base = 7;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_58._M_pi)->_M_use_count = 2;
  }
  uVar16 = (int)seen * 4 + 2;
  local_50 = (ulong)word_idx;
  bVar6 = false;
  local_38 = local_50 * 3;
  do {
    if ((uVar16 & 7) != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,0x2e3,
                    "std::shared_ptr<Form> LinkedObjectFile::to_form_script(int, int, std::vector<bool> &)"
                   );
    }
    to_form_script_object
              ((LinkedObjectFile *)&local_48,seg,word_idx,
               (vector<bool,_std::allocator<bool>_> *)(ulong)(uVar16 - 2));
    p_Var9 = p_Stack_40;
    pp_Var8 = local_48;
    local_48 = (_func_int **)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_60[1]._M_use_count;
    local_60[1]._vptr__Sp_counted_base = pp_Var8;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_60[1]._M_use_count = p_Var9;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
    uVar11 = uVar16 + 3;
    if (-1 < (int)uVar16) {
      uVar11 = uVar16;
    }
    rVar17 = std::vector<bool,_std::allocator<bool>_>::at(in_R8,(long)((int)uVar11 >> 2));
    *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
    uVar11 = uVar16 + 2;
    bVar10 = is_empty_list(this_00,word_idx,uVar11);
    _Var14 = gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
    peVar7 = gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (bVar10) {
      if (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_60[2]._vptr__Sp_counted_base = (_func_int **)peVar7;
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_60[2]._M_use_count;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_60[2]._M_use_count = _Var14._M_pi;
      _Var14._M_pi = local_60;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        _Var14._M_pi = extraout_RDX_02;
      }
LAB_001317af:
      bVar6 = true;
      bVar10 = false;
    }
    else {
      pvVar3 = (this_00->words_by_seg).
               super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = ((long)(this_00->words_by_seg).
                      super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
               -0x5555555555555555;
      uVar15 = local_50;
      if (uVar13 < local_50 || uVar13 - local_50 == 0) {
LAB_00131825:
        local_50 = uVar15;
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   local_50);
      }
      uVar15 = (ulong)((int)uVar11 >> 2);
      lVar4 = *(long *)((long)&(pvVar3->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)
                               ._M_impl.super__Vector_impl_data + local_38 * 8);
      uVar13 = (*(long *)((long)&(pvVar3->
                                 super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                                 _M_impl.super__Vector_impl_data + local_38 * 8 + 8) - lVar4 >> 4) *
               -0x5555555555555555;
      if (uVar13 < uVar15 || uVar13 - uVar15 == 0) goto LAB_00131825;
      if (*(int *)(lVar4 + uVar15 * 0x30) != 1) {
LAB_0013173b:
        sVar18 = to_form_script_object
                           ((LinkedObjectFile *)&local_48,seg,word_idx,
                            (vector<bool,_std::allocator<bool>_> *)(ulong)uVar11);
        p_Var9 = p_Stack_40;
        pp_Var8 = local_48;
        _Var14 = sVar18.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_48 = (_func_int **)0x0;
        p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_60[2]._M_use_count;
        local_60[2]._vptr__Sp_counted_base = pp_Var8;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_60[2]._M_use_count = p_Var9;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          _Var14._M_pi = extraout_RDX_00;
        }
        if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
          _Var14._M_pi = extraout_RDX_01;
        }
        goto LAB_001317af;
      }
      uVar15 = (ulong)*(int *)(lVar4 + uVar15 * 0x30 + 8);
      pLVar5 = (this_00->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = ((long)(this_00->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pLVar5 >> 3) * -0x3333333333333333;
      if (uVar13 < uVar15 || uVar13 - uVar15 == 0) goto LAB_00131825;
      uVar1 = pLVar5[uVar15].offset;
      if ((uVar1 & 7) != 2) goto LAB_0013173b;
      puVar12 = (undefined8 *)operator_new(0x40);
      puVar12[1] = 0x100000001;
      *puVar12 = &PTR___Sp_counted_ptr_inplace_0015b690;
      puVar12[2] = 0;
      puVar12[3] = 0;
      puVar12[4] = 0;
      puVar12[5] = 0;
      puVar12[6] = 0;
      puVar12[7] = 0;
      local_60[2]._vptr__Sp_counted_base = (_func_int **)(puVar12 + 2);
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_60[2]._M_use_count;
      *(undefined8 **)&local_60[2]._M_use_count = puVar12;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60[2]._vptr__Sp_counted_base;
      *(undefined4 *)&p_Var2->_vptr__Sp_counted_base = 7;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_58,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60[2]._M_use_count);
      bVar10 = true;
      _Var14._M_pi = extraout_RDX;
      uVar16 = uVar1;
      local_60 = p_Var2;
    }
    if (!bVar10) {
      if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
        _Var14._M_pi = extraout_RDX_03;
      }
      if ((!bVar6) &&
         (p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    &(this->stats).total_v2_pointers,
         p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        _Var14._M_pi = extraout_RDX_04;
      }
      sVar18.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var14._M_pi;
      sVar18.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
      return (shared_ptr<Form>)sVar18.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
    }
  } while( true );
}

Assistant:

std::shared_ptr<Form> LinkedObjectFile::to_form_script(int seg,
                                                       int word_idx,
                                                       std::vector<bool>& seen) {
  // the object to currently print. to start off, create pair from the car address we've been given.
  int goal_print_obj = word_idx * 4 + 2;

  // resulting form. we can't have a totally empty list (as an empty list looks like a symbol,
  // so it wouldn't be flagged), so it's safe to make this a pair.
  auto result = std::make_shared<Form>();
  result->kind = FormKind::PAIR;

  // the current pair to fill out.
  auto fill = result;

  // loop until we run out of things to add
  for (;;) {
    // check the thing to print is a a pair.
    if ((goal_print_obj & 7) == 2) {
      // first convert the car (again, with (&-> obj car))
      fill->pair[0] = to_form_script_object(seg, goal_print_obj - 2, seen);
      seen.at(goal_print_obj / 4) = true;

      auto cdr_addr = goal_print_obj + 2;

      if (is_empty_list(seg, cdr_addr)) {
        // the list has ended!
        fill->pair[1] = gSymbolTable.getEmptyPair();
        return result;
      } else {
        // cdr object should be aligned.
        assert((cdr_addr % 4) == 0);
        auto& cdr_word = words_by_seg.at(seg).at(cdr_addr / 4);
        // check for proper list
        if (cdr_word.kind == LinkedWord::PTR && (labels.at(cdr_word.label_id).offset & 7) == 2) {
          // yes, proper list. add another pair and link it in to the list.
          goal_print_obj = labels.at(cdr_word.label_id).offset;
          fill->pair[1] = std::make_shared<Form>();
          fill->pair[1]->kind = FormKind::PAIR;
          fill = fill->pair[1];
        } else {
          // improper list, put the last thing in and end
          fill->pair[1] = to_form_script_object(seg, cdr_addr, seen);
          return result;
        }
      }
    } else {
      // improper list, should be impossible to get here because of earlier checks
      assert(false);
    }
  }

  return result;
}